

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

uint32_t get_ptr_from(uint8_t ctrl,uint8_t *ptr,int ptr_size)

{
  uint32_t local_20;
  uint32_t new_offset;
  int ptr_size_local;
  uint8_t *ptr_local;
  uint8_t ctrl_local;
  
  switch(ptr_size) {
  case 1:
    local_20 = (ctrl & 7) * 0x100 + (uint)*ptr;
    break;
  case 2:
    local_20 = (ctrl & 7) * 0x10000 + 0x800 + (uint)*ptr * 0x100 + (uint)ptr[1];
    break;
  case 3:
    local_20 = get_uint24(ptr);
    local_20 = (ctrl & 7) * 0x1000000 + 0x80800 + local_20;
    break;
  case 4:
  default:
    local_20 = get_uint32(ptr);
  }
  return local_20;
}

Assistant:

static uint32_t
get_ptr_from(uint8_t ctrl, uint8_t const *const ptr, int ptr_size) {
    uint32_t new_offset;
    switch (ptr_size) {
        case 1:
            new_offset = (uint32_t)((ctrl & 7) << 8) + ptr[0];
            break;
        case 2:
            new_offset = 2048 + (uint32_t)((ctrl & 7) << 16) +
                         (uint32_t)(ptr[0] << 8) + ptr[1];
            break;
        case 3:
            new_offset =
                2048 + 524288 + (uint32_t)((ctrl & 7) << 24) + get_uint24(ptr);
            break;
        case 4:
        default:
            new_offset = get_uint32(ptr);
            break;
    }
    return new_offset;
}